

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_gen.cpp
# Opt level: O2

int __thiscall IntegerRandomGenerator::generate(IntegerRandomGenerator *this)

{
  pointer pdVar1;
  pointer pdVar2;
  reference pvVar3;
  reference pvVar4;
  size_type __n;
  double dVar5;
  uniform_real_distribution<double> local_38;
  
  local_38._M_param._M_a = 0.0;
  local_38._M_param._M_b = 1.0;
  dVar5 = std::uniform_real_distribution<double>::operator()(&local_38,&mRng);
  pdVar1 = (this->mDist).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar2 = (this->mDist).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  __n = 0;
  while( true ) {
    if (((ulong)((long)pdVar1 - (long)pdVar2) >> 3 & 0xffffffff) == __n) {
      return -1;
    }
    pvVar3 = std::vector<double,_std::allocator<double>_>::at(&this->mDist,__n);
    if (dVar5 < *pvVar3) break;
    pvVar3 = std::vector<double,_std::allocator<double>_>::at(&this->mDist,__n);
    dVar5 = dVar5 - *pvVar3;
    __n = __n + 1;
  }
  pvVar4 = std::vector<int,_std::allocator<int>_>::at(&this->mValues,__n);
  return *pvVar4;
}

Assistant:

int IntegerRandomGenerator::generate()
{
    std::uniform_real_distribution<double> unif(0,1);
    double random = unif(mRng);

    uint32_t distSize = static_cast<uint32_t>(mDist.size());
    for(uint32_t i = 0; i < distSize; i++)
    {
        if(random < mDist.at(i))
        {
            return mValues.at(i);
        }
        else
        {
            random -= mDist.at(i);
        }
    }

    return -1;
}